

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBT_correlation.cpp
# Opt level: O3

void __thiscall HBT_correlation::calculate_flow_event_plane_angle(HBT_correlation *this,int n_order)

{
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *pvVar1;
  vector<particle_info,_std::allocator<particle_info>_> *pvVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double local_50;
  
  pvVar1 = ((this->particle_list).super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->particle_list;
  uVar7 = (uint)((ulong)((long)(pvVar1->
                               super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pvVar1->
                              super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                              )._M_impl.super__Vector_impl_data._M_start) >> 3);
  if ((int)uVar7 < 1) {
    dVar9 = 0.0;
    local_50 = 0.0;
  }
  else {
    local_50 = 0.0;
    uVar8 = 0;
    dVar9 = 0.0;
    do {
      pvVar2 = (((this->particle_list).
                 super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                particle_list->
               super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
               )._M_impl.super__Vector_impl_data._M_start[uVar8];
      uVar5 = (int)((long)*(pointer *)
                           ((long)&pvVar2->
                                   super__Vector_base<particle_info,_std::allocator<particle_info>_>
                           + 8) -
                    *(long *)&pvVar2->
                              super__Vector_base<particle_info,_std::allocator<particle_info>_> >> 3
                   ) * -0x11111111;
      if (0 < (int)uVar5) {
        uVar6 = (ulong)(uVar5 & 0x7fffffff);
        lVar4 = 0x20;
        do {
          lVar3 = *(long *)&(((this->particle_list).
                              super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                             )->particle_list->
                            super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar8]->
                            super__Vector_base<particle_info,_std::allocator<particle_info>_>;
          dVar10 = atan2(*(double *)(lVar3 + lVar4),*(double *)(lVar3 + -8 + lVar4));
          dVar10 = dVar10 * (double)n_order;
          dVar11 = cos(dVar10);
          local_50 = local_50 + dVar11;
          dVar10 = sin(dVar10);
          dVar9 = dVar9 + dVar10;
          lVar4 = lVar4 + 0x78;
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uVar7 & 0x7fffffff));
  }
  dVar9 = atan2(dVar9,local_50);
  this->psi_ref = dVar9 / (double)n_order;
  return;
}

Assistant:

void HBT_correlation::calculate_flow_event_plane_angle(int n_order) {
    int nev = particle_list->get_number_of_events();
    double vn_real = 0.0;
    double vn_imag = 0.0;
    for (int iev = 0; iev < nev; iev++) {
        int event_number_particle =
            (particle_list->get_number_of_particles(iev));
        for (int i = 0; i < event_number_particle; i++) {
            double temp_px = particle_list->get_particle(iev, i).px;
            double temp_py = particle_list->get_particle(iev, i).py;
            double temp_phi = atan2(temp_py, temp_px);
            vn_real += cos(n_order * temp_phi);
            vn_imag += sin(n_order * temp_phi);
        }
    }
    psi_ref = atan2(vn_imag, vn_real) / n_order;
}